

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O0

void Fxu_CreateCoversNode
               (Fxu_Matrix *p,Fxu_Data_t *pData,int iNode,Fxu_Cube *pCubeFirst,Fxu_Cube *pCubeNext)

{
  int iVar1;
  Fxu_Var *pFVar2;
  char cVar3;
  int iVar4;
  Vec_Int_t *p_00;
  char *pSop;
  int local_6c;
  int local_68;
  int v;
  int nCubes;
  int iNum;
  Fxu_Lit *pLit;
  Fxu_Cube *pCube;
  Fxu_Var *pVar;
  char *pSopCube;
  char *pSopCover;
  Vec_Int_t *vInputsNew;
  Fxu_Cube *pCubeNext_local;
  Fxu_Cube *pCubeFirst_local;
  int iNode_local;
  Fxu_Data_t *pData_local;
  Fxu_Matrix *p_local;
  
  p->ppTailVars = &p->pOrderVars;
  p->pOrderVars = (Fxu_Var *)0x0;
  for (pLit = (Fxu_Lit *)pCubeFirst; (Fxu_Cube *)pLit != pCubeNext; pLit = *(Fxu_Lit **)(pLit + 1))
  {
    for (_nCubes = pLit->pHPrev; _nCubes != (Fxu_Lit *)0x0; _nCubes = _nCubes->pHNext) {
      pFVar2 = p->ppVars[(_nCubes->pVar->iVar / 2) * 2 + 1];
      if (pFVar2->pOrder == (Fxu_Var *)0x0) {
        *p->ppTailVars = pFVar2;
        p->ppTailVars = &pFVar2->pOrder;
        pFVar2->pOrder = (Fxu_Var *)0x1;
      }
    }
  }
  p_00 = Vec_IntAlloc(4);
  if (p->pOrderVars != (Fxu_Var *)0x0) {
    for (pCube = (Fxu_Cube *)p->pOrderVars; pCube != (Fxu_Cube *)0x1; pCube = pCube->pOrder) {
      Vec_IntPush(p_00,pCube->iCube / 2);
    }
  }
  Fxu_MatrixRingVarsUnmark(p);
  Vec_IntSort(p_00,0);
  for (local_6c = 0; local_6c < p_00->nSize; local_6c = local_6c + 1) {
    (p->ppVars[p_00->pArray[local_6c] << 1]->lLits).nItems = local_6c;
    (p->ppVars[p_00->pArray[local_6c] * 2 + 1]->lLits).nItems = local_6c;
  }
  local_68 = 0;
  for (pLit = (Fxu_Lit *)pCubeFirst; (Fxu_Cube *)pLit != pCubeNext; pLit = *(Fxu_Lit **)(pLit + 1))
  {
    if (*(int *)&pLit->pVPrev != 0) {
      local_68 = local_68 + 1;
    }
  }
  pSop = Abc_SopStart(pData->pManSop,local_68,p_00->nSize);
  if ((iNode < pData->nNodesOld) &&
     (iVar4 = Abc_SopGetPhase((char *)pData->vSops->pArray[iNode]), iVar4 == 0)) {
    Abc_SopComplement(pSop);
  }
  local_68 = 0;
  pLit = (Fxu_Lit *)pCubeFirst;
  do {
    if ((Fxu_Cube *)pLit == pCubeNext) {
      iVar4 = Abc_SopGetCubeNum(pSop);
      if (local_68 != iVar4) {
        __assert_fail("nCubes == Abc_SopGetCubeNum(pSopCover)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuCreate.c"
                      ,399,
                      "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                     );
      }
      pData->vSopsNew->pArray[iNode] = pSop;
      pData->vFaninsNew->pArray[iNode] = p_00;
      return;
    }
    if (*(int *)&pLit->pVPrev != 0) {
      iVar4 = local_68 * (p_00->nSize + 3);
      for (_nCubes = pLit->pHPrev; _nCubes != (Fxu_Lit *)0x0; _nCubes = _nCubes->pHNext) {
        iVar1 = (_nCubes->pVar->lLits).nItems;
        if (p_00->nSize <= iVar1) {
          __assert_fail("iNum < vInputsNew->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuCreate.c"
                        ,0x186,
                        "void Fxu_CreateCoversNode(Fxu_Matrix *, Fxu_Data_t *, int, Fxu_Cube *, Fxu_Cube *)"
                       );
        }
        if (_nCubes->pVar->iVar / 2 < pData->nNodesOld) {
          cVar3 = '1';
          if ((_nCubes->pVar->iVar & 1U) != 0) {
            cVar3 = '0';
          }
          pSop[(long)iVar1 + (long)iVar4] = cVar3;
        }
        else {
          cVar3 = '0';
          if ((_nCubes->pVar->iVar & 1U) != 0) {
            cVar3 = '1';
          }
          pSop[(long)iVar1 + (long)iVar4] = cVar3;
        }
      }
      local_68 = local_68 + 1;
    }
    pLit = *(Fxu_Lit **)(pLit + 1);
  } while( true );
}

Assistant:

void Fxu_CreateCoversNode( Fxu_Matrix * p, Fxu_Data_t * pData, int iNode, Fxu_Cube * pCubeFirst, Fxu_Cube * pCubeNext )
{
    Vec_Int_t * vInputsNew;
    char * pSopCover, * pSopCube;
    Fxu_Var * pVar;
    Fxu_Cube * pCube;
    Fxu_Lit * pLit;
    int iNum, nCubes, v;

    // collect positive polarity variable in the cubes between pCubeFirst and pCubeNext
    Fxu_MatrixRingVarsStart( p );
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            pVar = p->ppVars[ 2 * (pLit->pVar->iVar/2) + 1 ];
            if ( pVar->pOrder == NULL )
                Fxu_MatrixRingVarsAdd( p, pVar );
        }
    Fxu_MatrixRingVarsStop( p );

    // collect the variable numbers
    vInputsNew = Vec_IntAlloc( 4 );
    Fxu_MatrixForEachVarInRing( p, pVar )
        Vec_IntPush( vInputsNew, pVar->iVar / 2 );
    Fxu_MatrixRingVarsUnmark( p );

    // sort the vars by their number
    Vec_IntSort( vInputsNew, 0 );

    // mark the vars with their numbers in the sorted array
    for ( v = 0; v < vInputsNew->nSize; v++ )
    {
        p->ppVars[ 2 * vInputsNew->pArray[v] + 0 ]->lLits.nItems = v; // hack - reuse lLits.nItems
        p->ppVars[ 2 * vInputsNew->pArray[v] + 1 ]->lLits.nItems = v; // hack - reuse lLits.nItems
    }

    // count the number of cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
        if ( pCube->lLits.nItems )
            nCubes++;

    // allocate room for the new cover
    pSopCover = Abc_SopStart( pData->pManSop, nCubes, vInputsNew->nSize );
    // set the correct polarity of the cover
    if ( iNode < pData->nNodesOld && Abc_SopGetPhase( (char *)pData->vSops->pArray[iNode] ) == 0 )
        Abc_SopComplement( pSopCover );

    // add the cubes
    nCubes = 0;
    for ( pCube = pCubeFirst; pCube != pCubeNext; pCube = pCube->pNext )
    {
        if ( pCube->lLits.nItems == 0 )
            continue;
        // get hold of the SOP cube
        pSopCube = pSopCover + nCubes * (vInputsNew->nSize + 3);
        // insert literals
        for ( pLit = pCube->lLits.pHead; pLit; pLit = pLit->pHNext )
        {
            iNum = pLit->pVar->lLits.nItems; // hack - reuse lLits.nItems
            assert( iNum < vInputsNew->nSize );
            if ( pLit->pVar->iVar / 2 < pData->nNodesOld )
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '0' : '1';   // reverse CST
            else
                pSopCube[iNum] = (pLit->pVar->iVar & 1)? '1' : '0';   // no CST
        }
        // count the cube
        nCubes++;
    }
    assert( nCubes == Abc_SopGetCubeNum(pSopCover) );

    // set the new cover and the array of fanins
    pData->vSopsNew->pArray[iNode]   = pSopCover;
    pData->vFaninsNew->pArray[iNode] = vInputsNew;
}